

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O0

int Gem_GroupUnpack(int Groups,int *pVars)

{
  int local_20;
  int local_1c;
  int nGroups;
  int v;
  int *pVars_local;
  int Groups_local;
  
  local_20 = 0;
  local_1c = 0;
  for (pVars_local._4_4_ = Groups; pVars_local._4_4_ != 0;
      pVars_local._4_4_ = (int)pVars_local._4_4_ >> 1) {
    if ((pVars_local._4_4_ & 1) != 0) {
      pVars[local_20] = local_1c;
      local_20 = local_20 + 1;
    }
    local_1c = local_1c + 1;
  }
  return local_20;
}

Assistant:

int Gem_GroupUnpack( int Groups, int * pVars )
{
    int v, nGroups = 0;
    for ( v = 0; Groups; v++, Groups >>= 1 )
        if ( Groups & 1 )
            pVars[nGroups++] = v;
    return nGroups;
}